

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

void encodeBase31(char *result,int value,int nrchars)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = (ulong)(uint)value;
  result[nrchars] = '\0';
  for (uVar3 = (ulong)(uint)nrchars; iVar2 = (int)uVar1, 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar1 = (long)iVar2 / 0x1f;
    result[uVar3 - 1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar2 % 0x1f];
  }
  return;
}

Assistant:

static void encodeBase31(char *result, int value, int nrchars) {
    ASSERT(result);
    ASSERT(nrchars >= 0);
    result[nrchars] = 0; // zero-terminate!
    while (nrchars > 0) {
        nrchars--;
        result[nrchars] = ENCODE_CHARS[value % 31];
        value /= 31;
    }
}